

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_chunk_split(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint local_4c;
  uint local_48;
  int nLen;
  int nChunkLen;
  int nSepLen;
  char *zSep;
  char *zEnd;
  char *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  _nChunkLen = "\r\n";
  zIn = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_null(pjStack_18);
  }
  else {
    nLen = 2;
    local_48 = 0x4c;
    zEnd = jx9_value_to_string(*(jx9_value **)zIn,(int *)&local_4c);
    zSep = zEnd + (int)local_4c;
    if (1 < apArg_local._4_4_) {
      local_48 = jx9_value_to_int(*(jx9_value **)(zIn + 8));
      if ((int)local_48 < 1) {
        local_48 = 0x4c;
      }
      if ((2 < apArg_local._4_4_) &&
         (_nChunkLen = jx9_value_to_string(*(jx9_value **)(zIn + 0x10),&nLen), nLen < 1)) {
        _nChunkLen = "\r\n";
        nLen = 2;
      }
    }
    if ((int)local_4c < (int)local_48) {
      jx9_result_string_format
                (pjStack_18,"%.*s%.*s",(ulong)local_4c,zEnd,(ulong)(uint)nLen,_nChunkLen);
    }
    else {
      for (; zEnd < zSep; zEnd = zEnd + (int)local_48) {
        if ((int)zSep - (int)zEnd < (int)local_48) {
          local_48 = (int)zSep - (int)zEnd;
        }
        jx9_result_string_format
                  (pjStack_18,"%.*s%.*s",(ulong)local_48,zEnd,(ulong)(uint)nLen,_nChunkLen);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_chunk_split(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zSep = "\r\n";
	int nSepLen, nChunkLen, nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Nothing to split, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* initialize/Extract arguments */
	nSepLen = (int)sizeof("\r\n") - 1;
	nChunkLen = 76;
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nArg > 1 ){
		/* Chunk length */
		nChunkLen = jx9_value_to_int(apArg[1]);
		if( nChunkLen < 1 ){
			/* Switch back to the default length */
			nChunkLen = 76;
		}
		if( nArg > 2 ){
			/* Separator */
			zSep = jx9_value_to_string(apArg[2], &nSepLen);
			if( nSepLen < 1 ){
				/* Switch back to the default separator */
				zSep = "\r\n";
				nSepLen = (int)sizeof("\r\n") - 1;
			}
		}
	}
	/* Perform the requested operation */
	if( nChunkLen > nLen ){
		/* Nothing to split, return the string and the separator */
		jx9_result_string_format(pCtx, "%.*s%.*s", nLen, zIn, nSepLen, zSep);
		return JX9_OK;
	}
	while( zIn < zEnd ){
		if( nChunkLen > (int)(zEnd-zIn) ){
			nChunkLen = (int)(zEnd - zIn);
		}
		/* Append the chunk and the separator */
		jx9_result_string_format(pCtx, "%.*s%.*s", nChunkLen, zIn, nSepLen, zSep);
		/* Point beyond the chunk */
		zIn += nChunkLen;
	}
	return JX9_OK;
}